

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O1

void __thiscall QFutureInterfaceBase::reportStarted(QFutureInterfaceBase *this)

{
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  QFutureInterfaceBasePrivate *pQVar1;
  int i;
  ulong uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QFutureCallOutEvent local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar3 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar3) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar3) goto LAB_001eee2b;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001eee2b:
  if (((this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i & 0xeU) == 0) {
    (this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 3;
    pQVar1 = this->d;
    QEvent::QEvent(&local_68.super_QEvent,FutureCallOut);
    local_68.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_006af620;
    local_68.callOutType = Started;
    local_68.index1 = -1;
    local_68.index2 = -1;
    local_68.text.d.size = 0;
    local_68.text.d.d = (Data *)0x0;
    local_68.text.d.ptr = (char16_t *)0x0;
    if ((pQVar1->outputConnections).d.size != 0) {
      uVar2 = 0;
      do {
        (*(pQVar1->outputConnections).d.ptr[uVar2]->_vptr_QFutureCallOutInterface[2])();
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)(pQVar1->outputConnections).d.size);
    }
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_68);
    this->d->isValid = true;
  }
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::reportStarted()
{
    QMutexLocker locker(&d->m_mutex);
    if (d->state.loadRelaxed() & (Started|Canceled|Finished))
        return;
    d->setState(State(Started | Running));
    d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Started));
    d->isValid = true;
}